

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

void __thiscall ProKey::ProKey(ProKey *this,char *str)

{
  size_t sVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView local_38;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = str;
  QByteArrayView::QByteArrayView<const_char_*,_true>(&local_38,&local_28);
  QVar2.m_data = (storage_type *)local_38.m_size;
  QVar2.m_size = (qsizetype)this;
  QString::fromLatin1(QVar2);
  (this->super_ProString).m_offset = 0;
  sVar1 = qstrlen(local_28);
  (this->super_ProString).m_length = (int)sVar1;
  (this->super_ProString).m_file = 0;
  ProString::updatedHash(&this->super_ProString);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ProKey::ProKey(const char *str) :
    ProString(str, DoHash)
{
}